

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void xmlSchemaSAXHandleStartElementNs
               (void *ctx,xmlChar *localname,xmlChar *prefix,xmlChar *URI,int nb_namespaces,
               xmlChar **namespaces,int nb_attributes,int nb_defaulted,xmlChar **attributes)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  void *pvVar4;
  xmlChar *pxVar5;
  ulong uVar6;
  char *message;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  xmlChar xVar10;
  undefined4 in_register_00000084;
  char *pcVar11;
  xmlChar **ppxVar12;
  long lVar13;
  int iVar14;
  xmlChar *in_stack_ffffffffffffffb8;
  xmlSchemaValidCtxtPtr pxVar15;
  
  pcVar11 = (char *)CONCAT44(in_register_00000084,nb_namespaces);
  iVar3 = *(int *)((long)ctx + 0xac) + 1;
  *(int *)((long)ctx + 0xac) = iVar3;
  if (*(int *)((long)ctx + 0x130) <= iVar3 && *(int *)((long)ctx + 0x130) != -1) {
    return;
  }
  iVar3 = xmlSchemaValidatorPushElem((xmlSchemaValidCtxtPtr)ctx);
  if (iVar3 == -1) {
    message = "calling xmlSchemaValidatorPushElem()";
    pxVar15 = (xmlSchemaValidCtxtPtr)ctx;
  }
  else {
    lVar1 = *(long *)((long)ctx + 0xc0);
    iVar3 = xmlSAX2GetLineNumber(*(void **)((long)ctx + 0x50));
    *(int *)(lVar1 + 0x10) = iVar3;
    *(xmlChar **)(lVar1 + 0x18) = localname;
    *(xmlChar **)(lVar1 + 0x20) = URI;
    *(byte *)(lVar1 + 0x40) = *(byte *)(lVar1 + 0x40) | 0x20;
    if (0 < nb_namespaces) {
      ppxVar12 = namespaces + 1;
      do {
        if (*(void **)(lVar1 + 0x78) == (void *)0x0) {
          pvVar4 = (*xmlMalloc)(0x50);
          *(void **)(lVar1 + 0x78) = pvVar4;
          if (pvVar4 == (void *)0x0) {
            if ((xmlSchemaValidCtxtPtr)ctx != (xmlSchemaValidCtxtPtr)0x0) {
              ((xmlSchemaValidCtxtPtr)ctx)->nberrors = ((xmlSchemaValidCtxtPtr)ctx)->nberrors + 1;
              ((xmlSchemaValidCtxtPtr)ctx)->err = 0x71a;
            }
            pcVar11 = "allocating namespace bindings for SAX validation";
LAB_001b13ce:
            __xmlSimpleError(0x11,2,(xmlNodePtr)0x0,(char *)0x0,pcVar11);
            goto LAB_001b146f;
          }
          *(undefined8 *)(lVar1 + 0x80) = 0x500000000;
        }
        else {
          iVar3 = *(int *)(lVar1 + 0x84);
          if (iVar3 <= *(int *)(lVar1 + 0x80)) {
            *(int *)(lVar1 + 0x84) = iVar3 * 2;
            pvVar4 = (*xmlRealloc)(*(void **)(lVar1 + 0x78),(long)iVar3 << 5);
            *(void **)(lVar1 + 0x78) = pvVar4;
            if (pvVar4 == (void *)0x0) {
              if ((xmlSchemaValidCtxtPtr)ctx != (xmlSchemaValidCtxtPtr)0x0) {
                ((xmlSchemaValidCtxtPtr)ctx)->nberrors = ((xmlSchemaValidCtxtPtr)ctx)->nberrors + 1;
                ((xmlSchemaValidCtxtPtr)ctx)->err = 0x71a;
              }
              pcVar11 = "re-allocating namespace bindings for SAX validation";
              goto LAB_001b13ce;
            }
          }
        }
        iVar3 = *(int *)(lVar1 + 0x80);
        *(xmlChar **)(*(long *)(lVar1 + 0x78) + (long)iVar3 * 0x10) = ppxVar12[-1];
        pxVar5 = *ppxVar12;
        if (**ppxVar12 == '\0') {
          pxVar5 = (xmlChar *)0x0;
        }
        *(xmlChar **)(*(long *)(lVar1 + 0x78) + (long)(iVar3 * 2 + 1) * 8) = pxVar5;
        *(int *)(lVar1 + 0x80) = iVar3 + 1;
        ppxVar12 = ppxVar12 + 2;
        nb_namespaces = nb_namespaces + -1;
      } while (nb_namespaces != 0);
    }
    if ((nb_attributes != 0) && (bVar2 = 0 < nb_attributes, 0 < nb_attributes)) {
      lVar13 = 0;
      iVar3 = 0;
      do {
        iVar14 = *(int *)(attributes + lVar13 + 4) - *(int *)(attributes + lVar13 + 3);
        pvVar4 = (*xmlMallocAtomic)((long)(iVar14 + 1));
        if (pvVar4 == (void *)0x0) {
          if ((xmlSchemaValidCtxtPtr)ctx != (xmlSchemaValidCtxtPtr)0x0) {
            ((xmlSchemaValidCtxtPtr)ctx)->nberrors = ((xmlSchemaValidCtxtPtr)ctx)->nberrors + 1;
            ((xmlSchemaValidCtxtPtr)ctx)->err = 0x71a;
          }
          pcVar11 = "allocating string for decoded attribute";
          __xmlSimpleError(0x11,2,(xmlNodePtr)0x0,(char *)0x0,
                           "allocating string for decoded attribute");
LAB_001b1430:
          if (bVar2) goto LAB_001b146f;
          break;
        }
        if (iVar14 < 1) {
          uVar6 = 0;
        }
        else {
          uVar6 = 0;
          uVar8 = 0;
          do {
            if (((((int)uVar8 < iVar14 + -4) &&
                 (pxVar5 = attributes[lVar13 + 3], pxVar5[uVar8] == '&')) &&
                (pxVar5[uVar8 + 1] == '#')) &&
               (((pxVar5[uVar8 + 2] == '3' && (pxVar5[uVar8 + 3] == '8')) &&
                (pxVar5[uVar8 + 4] == ';')))) {
              iVar9 = 5;
              xVar10 = '&';
            }
            else {
              xVar10 = attributes[lVar13 + 3][uVar8];
              iVar9 = 1;
            }
            *(xmlChar *)((long)pvVar4 + uVar6) = xVar10;
            uVar7 = (int)uVar8 + iVar9;
            uVar8 = (ulong)uVar7;
            uVar6 = uVar6 + 1;
          } while ((int)uVar7 < iVar14);
          uVar6 = uVar6 & 0xffffffff;
        }
        *(undefined1 *)((long)pvVar4 + uVar6) = 0;
        pcVar11 = (char *)attributes[lVar13 + 2];
        iVar14 = xmlSchemaValidatorPushAttribute
                           ((xmlSchemaValidCtxtPtr)ctx,(xmlNodePtr)0x0,*(int *)(lVar1 + 0x10),
                            attributes[lVar13],(xmlChar *)pcVar11,(int)pvVar4,
                            in_stack_ffffffffffffffb8,(int)ctx);
        if (iVar14 == -1) {
          xmlSchemaInternalErr2
                    ((xmlSchemaAbstractCtxtPtr)ctx,"xmlSchemaSAXHandleStartElementNs",
                     "calling xmlSchemaValidatorPushAttribute()",(xmlChar *)0x0,(xmlChar *)pcVar11);
          goto LAB_001b1430;
        }
        iVar3 = iVar3 + 1;
        lVar13 = lVar13 + 5;
        bVar2 = iVar3 < nb_attributes;
      } while (iVar3 != nb_attributes);
    }
    pxVar15 = (xmlSchemaValidCtxtPtr)ctx;
    iVar3 = xmlSchemaValidateElem((xmlSchemaValidCtxtPtr)ctx);
    if (iVar3 != -1) {
      return;
    }
    message = "calling xmlSchemaValidateElem()";
  }
  xmlSchemaInternalErr2
            ((xmlSchemaAbstractCtxtPtr)ctx,"xmlSchemaSAXHandleStartElementNs",message,(xmlChar *)0x0
             ,(xmlChar *)pcVar11);
  ctx = pxVar15;
LAB_001b146f:
  ((xmlSchemaValidCtxtPtr)ctx)->err = -1;
  xmlStopParser(((xmlSchemaValidCtxtPtr)ctx)->parserCtxt);
  return;
}

Assistant:

static void
xmlSchemaSAXHandleStartElementNs(void *ctx,
				 const xmlChar * localname,
				 const xmlChar * prefix ATTRIBUTE_UNUSED,
				 const xmlChar * URI,
				 int nb_namespaces,
				 const xmlChar ** namespaces,
				 int nb_attributes,
				 int nb_defaulted ATTRIBUTE_UNUSED,
				 const xmlChar ** attributes)
{
    xmlSchemaValidCtxtPtr vctxt = (xmlSchemaValidCtxtPtr) ctx;
    int ret;
    xmlSchemaNodeInfoPtr ielem;
    int i, j;

    /*
    * SAX VAL TODO: What to do with nb_defaulted?
    */
    /*
    * Skip elements if inside a "skip" wildcard or invalid.
    */
    vctxt->depth++;
    if ((vctxt->skipDepth != -1) && (vctxt->depth >= vctxt->skipDepth))
	return;
    /*
    * Push the element.
    */
    if (xmlSchemaValidatorPushElem(vctxt) == -1) {
	VERROR_INT("xmlSchemaSAXHandleStartElementNs",
	    "calling xmlSchemaValidatorPushElem()");
	goto internal_error;
    }
    ielem = vctxt->inode;
    /*
    * TODO: Is this OK?
    */
    ielem->nodeLine = xmlSAX2GetLineNumber(vctxt->parserCtxt);
    ielem->localName = localname;
    ielem->nsName = URI;
    ielem->flags |= XML_SCHEMA_ELEM_INFO_EMPTY;
    /*
    * Register namespaces on the elem info.
    */
    if (nb_namespaces != 0) {
	/*
	* Although the parser builds its own namespace list,
	* we have no access to it, so we'll use an own one.
	*/
        for (i = 0, j = 0; i < nb_namespaces; i++, j += 2) {
	    /*
	    * Store prefix and namespace name.
	    */
	    if (ielem->nsBindings == NULL) {
		ielem->nsBindings =
		    (const xmlChar **) xmlMalloc(10 *
			sizeof(const xmlChar *));
		if (ielem->nsBindings == NULL) {
		    xmlSchemaVErrMemory(vctxt,
			"allocating namespace bindings for SAX validation",
			NULL);
		    goto internal_error;
		}
		ielem->nbNsBindings = 0;
		ielem->sizeNsBindings = 5;
	    } else if (ielem->sizeNsBindings <= ielem->nbNsBindings) {
		ielem->sizeNsBindings *= 2;
		ielem->nsBindings =
		    (const xmlChar **) xmlRealloc(
			(void *) ielem->nsBindings,
			ielem->sizeNsBindings * 2 * sizeof(const xmlChar *));
		if (ielem->nsBindings == NULL) {
		    xmlSchemaVErrMemory(vctxt,
			"re-allocating namespace bindings for SAX validation",
			NULL);
		    goto internal_error;
		}
	    }

	    ielem->nsBindings[ielem->nbNsBindings * 2] = namespaces[j];
	    if (namespaces[j+1][0] == 0) {
		/*
		* Handle xmlns="".
		*/
		ielem->nsBindings[ielem->nbNsBindings * 2 + 1] = NULL;
	    } else
		ielem->nsBindings[ielem->nbNsBindings * 2 + 1] =
		    namespaces[j+1];
	    ielem->nbNsBindings++;
	}
    }
    /*
    * Register attributes.
    * SAX VAL TODO: We are not adding namespace declaration
    * attributes yet.
    */
    if (nb_attributes != 0) {
	int valueLen, k, l;
	xmlChar *value;

        for (j = 0, i = 0; i < nb_attributes; i++, j += 5) {
	    /*
	    * Duplicate the value, changing any &#38; to a literal ampersand.
	    *
	    * libxml2 differs from normal SAX here in that it escapes all ampersands
	    * as &#38; instead of delivering the raw converted string. Changing the
	    * behavior at this point would break applications that use this API, so
	    * we are forced to work around it.
	    */
	    valueLen = attributes[j+4] - attributes[j+3];
	    value = xmlMallocAtomic(valueLen + 1);
	    if (value == NULL) {
		xmlSchemaVErrMemory(vctxt,
		    "allocating string for decoded attribute",
		    NULL);
		goto internal_error;
	    }
	    for (k = 0, l = 0; k < valueLen; l++) {
		if (k < valueLen - 4 &&
		    attributes[j+3][k+0] == '&' &&
		    attributes[j+3][k+1] == '#' &&
		    attributes[j+3][k+2] == '3' &&
		    attributes[j+3][k+3] == '8' &&
		    attributes[j+3][k+4] == ';') {
		    value[l] = '&';
		    k += 5;
		} else {
		    value[l] = attributes[j+3][k];
		    k++;
		}
	    }
	    value[l] = '\0';
	    /*
	    * TODO: Set the node line.
	    */
	    ret = xmlSchemaValidatorPushAttribute(vctxt,
		NULL, ielem->nodeLine, attributes[j], attributes[j+2], 0,
		value, 1);
	    if (ret == -1) {
		VERROR_INT("xmlSchemaSAXHandleStartElementNs",
		    "calling xmlSchemaValidatorPushAttribute()");
		goto internal_error;
	    }
	}
    }
    /*
    * Validate the element.
    */
    ret = xmlSchemaValidateElem(vctxt);
    if (ret != 0) {
	if (ret == -1) {
	    VERROR_INT("xmlSchemaSAXHandleStartElementNs",
		"calling xmlSchemaValidateElem()");
	    goto internal_error;
	}
	goto exit;
    }

exit:
    return;
internal_error:
    vctxt->err = -1;
    xmlStopParser(vctxt->parserCtxt);
    return;
}